

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O3

void __thiscall JetHead::list<Timer::TimerNode>::~list(list<Timer::TimerNode> *this)

{
  Node *pNVar1;
  Node *this_00;
  
  this_00 = this->mHead;
  while (this_00 != (Node *)0x0) {
    pNVar1 = this_00->next;
    SmartPtr<Event>::~SmartPtr((SmartPtr<Event> *)this_00);
    operator_delete(this_00,0x38);
    this->mHead = pNVar1;
    this_00 = pNVar1;
  }
  this->mTail = (Node *)0x0;
  return;
}

Assistant:

~list()
		{
			while (mHead != NULL)
			{
				Node* temp = mHead->next;
				delete mHead;
				mHead = temp;
			}
			mTail = NULL;
		}